

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

void __thiscall libtorrent::upnp::rootdevice::rootdevice(rootdevice *this,rootdevice *param_1)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  bool bVar4;
  
  (this->url)._M_dataplus._M_p = (pointer)&(this->url).field_2;
  pcVar1 = (param_1->url)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->url)._M_string_length);
  (this->control_url)._M_dataplus._M_p = (pointer)&(this->control_url).field_2;
  pcVar1 = (param_1->control_url)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->control_url,pcVar1,pcVar1 + (param_1->control_url)._M_string_length);
  (this->service_namespace)._M_dataplus._M_p = (pointer)&(this->service_namespace).field_2;
  pcVar1 = (param_1->service_namespace)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->service_namespace,pcVar1,
             pcVar1 + (param_1->service_namespace)._M_string_length);
  ::std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::vector
            (&(this->mapping).
              super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
             ,&(param_1->mapping).
               super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
            );
  (this->hostname)._M_dataplus._M_p = (pointer)&(this->hostname).field_2;
  pcVar1 = (param_1->hostname)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->hostname,pcVar1,pcVar1 + (param_1->hostname)._M_string_length);
  this->port = param_1->port;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (param_1->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path,pcVar1,pcVar1 + (param_1->path)._M_string_length);
  (this->external_ip).super_address.type_ = (param_1->external_ip).super_address.type_;
  (this->external_ip).super_address.ipv4_address_.addr_.s_addr =
       (param_1->external_ip).super_address.ipv4_address_.addr_.s_addr;
  uVar3 = *(undefined8 *)
           ((long)&(param_1->external_ip).super_address.ipv6_address_.addr_.__in6_u + 8);
  *(undefined8 *)&(this->external_ip).super_address.ipv6_address_.addr_.__in6_u =
       *(undefined8 *)&(param_1->external_ip).super_address.ipv6_address_.addr_.__in6_u;
  *(undefined8 *)((long)&(this->external_ip).super_address.ipv6_address_.addr_.__in6_u + 8) = uVar3;
  (this->external_ip).super_address.ipv6_address_.scope_id_ =
       (param_1->external_ip).super_address.ipv6_address_.scope_id_;
  this->disabled = param_1->disabled;
  bVar4 = param_1->supports_specific_external;
  this->use_lease_duration = param_1->use_lease_duration;
  this->supports_specific_external = bVar4;
  (this->upnp_connection).
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->upnp_connection).
       super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->upnp_connection).
           super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->upnp_connection).
  super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

upnp::rootdevice::rootdevice(rootdevice const&) = default;